

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O2

void __thiscall
GeneratorExpressionContent::~GeneratorExpressionContent(GeneratorExpressionContent *this)

{
  pointer pvVar1;
  pointer r;
  
  (this->super_cmGeneratorExpressionEvaluator)._vptr_cmGeneratorExpressionEvaluator =
       (_func_int **)&PTR__GeneratorExpressionContent_0064d1b0;
  cmDeleteAll<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
            (&this->IdentifierChildren);
  pvVar1 = (this->ParamChildren).
           super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (r = (this->ParamChildren).
           super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start; r != pvVar1; r = r + 1) {
    cmDeleteAll<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
              (r);
  }
  std::
  vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
  ::~vector(&this->ParamChildren);
  std::
  _Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  ::~_Vector_base(&(this->IdentifierChildren).
                   super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                 );
  return;
}

Assistant:

GeneratorExpressionContent::~GeneratorExpressionContent()
{
  cmDeleteAll(this->IdentifierChildren);
  std::for_each(this->ParamChildren.begin(), this->ParamChildren.end(),
                cmDeleteAll<std::vector<cmGeneratorExpressionEvaluator*> >);
}